

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-connection-fail.c
# Opt level: O3

int run_test_connection_fail_doesnt_auto_close(void)

{
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  undefined8 uVar2;
  int iVar3;
  
  uVar2 = uv_default_loop();
  iVar3 = 0x2dfb28;
  iVar1 = uv_timer_init(uVar2);
  if (iVar1 == 0) {
    connection_fail(on_connect_without_close);
    if (timer_close_cb_calls != 1) goto LAB_0014d8e0;
    if (timer_cb_calls == 1) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      iVar3 = 0;
      uv_run(uVar2);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014d8ea;
    }
  }
  else {
    run_test_connection_fail_doesnt_auto_close_cold_1();
LAB_0014d8e0:
    run_test_connection_fail_doesnt_auto_close_cold_2();
  }
  run_test_connection_fail_doesnt_auto_close_cold_3();
LAB_0014d8ea:
  run_test_connection_fail_doesnt_auto_close_cold_4();
  if (iVar3 == -0x6f) {
    connect_cb_calls = connect_cb_calls + 1;
    uv_timer_start(&timer,timer_cb,100,0);
    if (close_cb_calls == 0) {
      return extraout_EAX;
    }
  }
  else {
    on_connect_without_close_cold_1();
  }
  on_connect_without_close_cold_2();
  close_cb_calls = close_cb_calls + 1;
  return extraout_EAX_00;
}

Assistant:

TEST_IMPL(connection_fail_doesnt_auto_close) {
  int r;

  r = uv_timer_init(uv_default_loop(), &timer);
  ASSERT(r == 0);

  connection_fail(on_connect_without_close);

  ASSERT(timer_close_cb_calls == 1);
  ASSERT(timer_cb_calls == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}